

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O0

void __thiscall ContextTest_StringFormat_Test::TestBody(ContextTest_StringFormat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_4b8;
  Message local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_1;
  allocator local_461;
  string local_460 [32];
  AssertHelper local_440;
  Message local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar;
  ostringstream local_3f0 [8];
  ostringstream os;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  undefined1 local_228 [24];
  CcsContext ctx;
  CcsContext root;
  string local_1f0;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  CcsDomain local_18;
  CcsDomain ccs;
  ContextTest_StringFormat_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"b c : @constrain d.e",&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"<literal>",
             (allocator *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::loadCcsStream
            (&local_18,(istream *)local_198,&local_1f0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::build
            ((CcsDomain *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"c",&local_249);
  ::ccs::CcsContext::constrain
            ((CcsContext *)local_228,
             (string *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"b",&local_271);
  ::ccs::CcsContext::constrain((CcsContext *)(local_228 + 0x10),(string *)local_228);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  ::ccs::CcsContext::~CcsContext((CcsContext *)local_228);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::ostringstream::ostringstream(local_3f0);
  ::ccs::CcsContext::CcsContext((CcsContext *)&gtest_ar.message_,(CcsContext *)(local_228 + 0x10));
  ::ccs::operator<<((ostream *)local_3f0,(CcsContext *)&gtest_ar.message_);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar.message_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_410,"\"c > b/d.e\"","os.str()",(char (*) [10])0x1f82a4,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"",&local_461);
  std::__cxx11::ostringstream::str((string *)local_3f0);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  ::ccs::CcsContext::CcsContext
            ((CcsContext *)&gtest_ar_1.message_,
             (CcsContext *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::ccs::operator<<((ostream *)local_3f0,(CcsContext *)&gtest_ar_1.message_);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar_1.message_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_488,"\"<root>\"","os.str()",(char (*) [7])"<root>",&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  std::__cxx11::ostringstream::~ostringstream(local_3f0);
  ::ccs::CcsContext::~CcsContext((CcsContext *)(local_228 + 0x10));
  ::ccs::CcsContext::~CcsContext
            ((CcsContext *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream(local_198);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(ContextTest, StringFormat) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").constrain("b");

  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());

  os.str("");
  os << root;
  EXPECT_EQ("<root>", os.str());
}